

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringhelper.cpp
# Opt level: O3

string * toLower(string *__return_storage_ptr__,string *in)

{
  size_type sVar1;
  pointer pcVar2;
  int iVar3;
  char *__s;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  
  sVar1 = in->_M_string_length;
  lVar6 = sVar1 << 0x20;
  __s = (char *)operator_new__(lVar6 + 0x100000000 >> 0x20);
  uVar7 = (uint)sVar1;
  if (0 < (int)uVar7) {
    pcVar2 = (in->_M_dataplus)._M_p;
    uVar5 = 0;
    do {
      iVar3 = tolower((int)pcVar2[uVar5]);
      __s[uVar5] = (char)iVar3;
      uVar5 = uVar5 + 1;
    } while ((uVar7 & 0x7fffffff) != uVar5);
  }
  __s[lVar6 >> 0x20] = '\0';
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar4 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,__s,__s + sVar4);
  operator_delete__(__s);
  return __return_storage_ptr__;
}

Assistant:

std::string toLower(std::string in ) {
     int len = static_cast<int>( in.size() );
     char *buffer = new char[len + 1];
     for( int i = 0; i < len; i++ ) {
        char thischar = in[i];
        thischar = tolower(thischar);
        buffer[i] = thischar;
    }
    buffer[len] = 0;
    std::string result = std::string(buffer);
    delete[] buffer;
    return result;
}